

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcts.h
# Opt level: O3

unique_ptr<MCTS::Node<ConnectFourState>,_std::default_delete<MCTS::Node<ConnectFourState>_>_>
MCTS::compute_tree<ConnectFourState>
          (ConnectFourState *root_state,ComputeOptions options,result_type initial_seed)

{
  bool bVar1;
  Node<ConnectFourState> *pNVar2;
  Node<ConnectFourState> *this;
  runtime_error *this_00;
  long lVar3;
  ulong in_RDX;
  int iVar4;
  double dVar5;
  ConnectFourState state;
  mt19937_64 random_engine;
  Move local_a34;
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  *local_a30;
  ConnectFourState local_a28;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  local_9f8;
  
  lVar3 = 1;
  do {
    in_RDX = (in_RDX >> 0x3e ^ in_RDX) * 0x5851f42d4c957f2d + lVar3;
    local_9f8._M_x[lVar3] = in_RDX;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x138);
  local_9f8._M_p = 0x138;
  if ((options.max_iterations < 0) && (options.max_time < 0.0)) {
    assertion_failed("options.max_iterations >= 0 || options.max_time >= 0",
                     "/workspace/llm4binary/github/license_c_cmakelists/PetterS[P]monte-carlo-tree-search/mcts.h"
                     ,0x135);
  }
  if (0.0 <= options.max_time) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"ComputeOptions::max_time requires OpenMP.");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar4 = *(int *)initial_seed;
  if (1 < iVar4 - 1U) {
    assertion_failed("root_state.player_to_move == 1 || root_state.player_to_move == 2",
                     "/workspace/llm4binary/github/license_c_cmakelists/PetterS[P]monte-carlo-tree-search/mcts.h"
                     ,0x13c);
  }
  pNVar2 = (Node<ConnectFourState> *)operator_new(0x60);
  pNVar2->move = -1;
  pNVar2->parent = (Node<ConnectFourState> *)0x0;
  pNVar2->player_to_move = iVar4;
  pNVar2->wins = 0.0;
  pNVar2->visits = 0;
  ConnectFourState::get_moves(&pNVar2->moves,(ConnectFourState *)initial_seed);
  (pNVar2->children).
  super__Vector_base<MCTS::Node<ConnectFourState>_*,_std::allocator<MCTS::Node<ConnectFourState>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pNVar2->UCT_score = 0.0;
  (pNVar2->children).
  super__Vector_base<MCTS::Node<ConnectFourState>_*,_std::allocator<MCTS::Node<ConnectFourState>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pNVar2->children).
  super__Vector_base<MCTS::Node<ConnectFourState>_*,_std::allocator<MCTS::Node<ConnectFourState>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(Node<ConnectFourState> **)root_state = pNVar2;
  ConnectFourState::ConnectFourState(&local_a28,6,7);
  if (options.max_iterations != 0) {
    local_a30 = (vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                 *)(initial_seed + 0x10);
    iVar4 = 1;
    do {
      local_a28.num_cols = *(int *)(initial_seed + 8);
      local_a28._0_8_ = *(undefined8 *)initial_seed;
      std::
      vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ::operator=(&local_a28.board,local_a30);
      local_a28._40_8_ = *(undefined8 *)(initial_seed + 0x28);
      this = pNVar2;
      while ((this->moves).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start ==
             (this->moves).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish) {
        if ((this->children).
            super__Vector_base<MCTS::Node<ConnectFourState>_*,_std::allocator<MCTS::Node<ConnectFourState>_*>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            (this->children).
            super__Vector_base<MCTS::Node<ConnectFourState>_*,_std::allocator<MCTS::Node<ConnectFourState>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish) goto LAB_0010d4ff;
        this = Node<ConnectFourState>::select_child_UCT(this);
        ConnectFourState::do_move(&local_a28,this->move);
      }
      local_a34 = Node<ConnectFourState>::
                  get_untried_move<std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                            (this,&local_9f8);
      ConnectFourState::do_move(&local_a28,local_a34);
      this = Node<ConnectFourState>::add_child(this,&local_a34,&local_a28);
LAB_0010d4ff:
      while( true ) {
        bVar1 = ConnectFourState::has_moves(&local_a28);
        if (!bVar1) break;
        ConnectFourState::
        do_random_move<std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                  (&local_a28,&local_9f8);
      }
      for (; this != (Node<ConnectFourState> *)0x0; this = this->parent) {
        dVar5 = ConnectFourState::get_result(&local_a28,this->player_to_move);
        this->visits = this->visits + 1;
        this->wins = dVar5 + this->wins;
      }
      bVar1 = iVar4 != options.max_iterations;
      iVar4 = iVar4 + 1;
    } while (bVar1);
  }
  std::
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::~vector(&local_a28.board);
  return (__uniq_ptr_data<MCTS::Node<ConnectFourState>,_std::default_delete<MCTS::Node<ConnectFourState>_>,_true,_true>
          )(__uniq_ptr_data<MCTS::Node<ConnectFourState>,_std::default_delete<MCTS::Node<ConnectFourState>_>,_true,_true>
            )root_state;
}

Assistant:

std::unique_ptr<Node<State>>  compute_tree(const State root_state,
                                           const ComputeOptions options,
                                           std::mt19937_64::result_type initial_seed)
{
	std::mt19937_64 random_engine(initial_seed);

	attest(options.max_iterations >= 0 || options.max_time >= 0);
	if (options.max_time >= 0) {
		#ifndef USE_OPENMP
		throw std::runtime_error("ComputeOptions::max_time requires OpenMP.");
		#endif
	}
	// Will support more players later.
	attest(root_state.player_to_move == 1 || root_state.player_to_move == 2);
	auto root = std::unique_ptr<Node<State>>(new Node<State>(root_state));

	#ifdef USE_OPENMP
	double start_time = ::omp_get_wtime();
	double print_time = start_time;
	#endif

	State state;
	for (int iter = 1; iter <= options.max_iterations || options.max_iterations < 0; ++iter) {
		auto node = root.get();
		state = root_state;

		// Select a path through the tree to a leaf node.
		while (!node->has_untried_moves() && node->has_children()) {
			node = node->select_child_UCT();
			state.do_move(node->move);
		}

		// If we are not already at the final state, expand the
		// tree with a new node and move there.
		if (node->has_untried_moves()) {
			auto move = node->get_untried_move(&random_engine);
			state.do_move(move);
			node = node->add_child(move, state);
		}

		// We now play randomly until the game ends.
		while (state.has_moves()) {
			state.do_random_move(&random_engine);
		}

		// We have now reached a final state. Backpropagate the result
		// up the tree to the root node.
		while (node != nullptr) {
			node->update(state.get_result(node->player_to_move));
			node = node->parent;
		}

		#ifdef USE_OPENMP
		if (options.verbose || options.max_time >= 0) {
			double time = ::omp_get_wtime();
			if (options.verbose && (time - print_time >= 1.0 || iter == options.max_iterations)) {
				std::cerr << iter << " games played (" << double(iter) / (time - start_time) << " / second)." << endl;
				print_time = time;
			}

			if (time - start_time >= options.max_time) {
				break;
			}
		}
		#endif
	}

	return root;
}